

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkBinaryRegistry.cpp
# Opt level: O1

void __thiscall
vk::BinaryRegistryDetail::BinaryRegistryWriter::BinaryRegistryWriter
          (BinaryRegistryWriter *this,string *dstPath)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  FilePath local_48;
  
  this->m_dstPath = dstPath;
  (this->m_binaryIndices).
  super__Vector_base<vk::BinaryRegistryDetail::ProgramIdentifierIndex,_std::allocator<vk::BinaryRegistryDetail::ProgramIdentifierIndex>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_binaryIndices).
  super__Vector_base<vk::BinaryRegistryDetail::ProgramIdentifierIndex,_std::allocator<vk::BinaryRegistryDetail::ProgramIdentifierIndex>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_binaryIndices).
  super__Vector_base<vk::BinaryRegistryDetail::ProgramIdentifierIndex,_std::allocator<vk::BinaryRegistryDetail::ProgramIdentifierIndex>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  BinaryIndexHash::BinaryIndexHash(&this->m_binaryHash);
  (this->m_binaries).
  super__Vector_base<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot,_std::allocator<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_binaries).
  super__Vector_base<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot,_std::allocator<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_binaries).
  super__Vector_base<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot,_std::allocator<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  paVar1 = &local_48.m_path.field_2;
  pcVar2 = (dstPath->_M_dataplus)._M_p;
  local_48.m_path._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar2,pcVar2 + dstPath->_M_string_length);
  bVar3 = de::FilePath::exists(&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.m_path._M_dataplus._M_p != paVar1) {
    operator_delete(local_48.m_path._M_dataplus._M_p,
                    local_48.m_path.field_2._M_allocated_capacity + 1);
  }
  if (bVar3) {
    initFromPath(this,dstPath);
  }
  return;
}

Assistant:

BinaryRegistryWriter::BinaryRegistryWriter (const std::string& dstPath)
	: m_dstPath(dstPath)
{
	if (de::FilePath(dstPath).exists())
		initFromPath(dstPath);
}